

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O1

Subscriber __thiscall miniros::NodeHandle::subscribe(NodeHandle *this,SubscribeOptions *ops)

{
  long lVar1;
  TopicManager *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  CallbackQueue *pCVar5;
  TopicManagerPtr *pTVar6;
  SubscribeOptions *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  pthread_mutex_t *__mutex;
  Subscriber SVar8;
  string local_48;
  
  resolveName(&local_48,(NodeHandle *)ops,&in_RDX->topic,true);
  std::__cxx11::string::operator=((string *)in_RDX,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (in_RDX->callback_queue == (CallbackQueueInterface *)0x0) {
    pCVar5 = (CallbackQueue *)
             (ops->transport_hints).transports_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar5 == (CallbackQueue *)0x0) {
      pCVar5 = getGlobalCallbackQueue();
    }
    in_RDX->callback_queue = &pCVar5->super_CallbackQueueInterface;
  }
  pTVar6 = TopicManager::instance();
  this_00 = (pTVar6->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_01 = (pTVar6->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  bVar3 = TopicManager::subscribe(this_00,in_RDX);
  _Var7._M_pi = extraout_RDX;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (bVar3) {
    Subscriber::Subscriber((Subscriber *)this,&in_RDX->topic,(NodeHandle *)ops,&in_RDX->helper);
    __mutex = (pthread_mutex_t *)
              ((ops->transport_hints).transports_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    pbVar2 = (ops->transport_hints).transports_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48._M_dataplus._M_p = (this->namespace_)._M_dataplus._M_p;
    local_48._M_string_length = (this->namespace_)._M_string_length;
    if ((long *)local_48._M_string_length != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_48._M_string_length + 0xc) = *(int *)(local_48._M_string_length + 0xc) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_48._M_string_length + 0xc) = *(int *)(local_48._M_string_length + 0xc) + 1;
      }
    }
    std::
    vector<std::weak_ptr<miniros::Subscriber::Impl>,std::allocator<std::weak_ptr<miniros::Subscriber::Impl>>>
    ::emplace_back<std::weak_ptr<miniros::Subscriber::Impl>>
              ((vector<std::weak_ptr<miniros::Subscriber::Impl>,std::allocator<std::weak_ptr<miniros::Subscriber::Impl>>>
                *)pbVar2[1].field_2._M_local_buf,(weak_ptr<miniros::Subscriber::Impl> *)&local_48);
    if ((long *)local_48._M_string_length != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        lVar1 = local_48._M_string_length + 0xc;
        iVar4 = *(int *)lVar1;
        *(int *)lVar1 = *(int *)lVar1 + -1;
        UNLOCK();
      }
      else {
        iVar4 = *(int *)(local_48._M_string_length + 0xc);
        *(int *)(local_48._M_string_length + 0xc) = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (**(code **)(*(long *)local_48._M_string_length + 0x18))();
      }
    }
    pthread_mutex_unlock(__mutex);
    _Var7._M_pi = extraout_RDX_01;
  }
  else {
    (this->namespace_)._M_dataplus._M_p = (pointer)0x0;
    (this->namespace_)._M_string_length = 0;
  }
  SVar8.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  SVar8.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Subscriber)
         SVar8.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Subscriber NodeHandle::subscribe(SubscribeOptions& ops)
{
  ops.topic = resolveName(ops.topic);
  if (ops.callback_queue == 0)
  {
    if (callback_queue_)
    {
      ops.callback_queue = callback_queue_;
    }
    else
    {
      ops.callback_queue = getGlobalCallbackQueue();
    }
  }

  if (getTopicManager()->subscribe(ops))
  {
    Subscriber sub(ops.topic, *this, ops.helper);

    {
      std::scoped_lock<std::mutex> lock(collection_->mutex_);
      collection_->subs_.push_back(sub.impl_);
    }

    return sub;
  }

  return Subscriber();
}